

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::StaticAssertTask::StaticAssertTask(StaticAssertTask *this)

{
  allocator<char> local_31;
  string local_30;
  StaticAssertTask *local_10;
  StaticAssertTask *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"$static_assert",&local_31)
  ;
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,&local_30,Task);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__StaticAssertTask_009178b0;
  return;
}

Assistant:

StaticAssertTask() : SystemSubroutine("$static_assert", SubroutineKind::Task) {}